

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_hook_sys_call.cpp
# Opt level: O0

int setenv(char *__name,char *__value,int __replace)

{
  bool bVar1;
  int iVar2;
  stCoRoutine_t *psVar3;
  stCoSysEnvArr_t *psVar4;
  void *pvVar5;
  char *local_78;
  stCoSysEnv_t *e;
  stCoSysEnv_t name;
  stCoSysEnvArr_t *arr;
  stCoRoutine_t *self;
  int overwrite_local;
  char *value_local;
  char *n_local;
  
  if (g_sys_setenv_func == (setenv_pfn_t)0x0) {
    g_sys_setenv_func = (setenv_pfn_t)dlsym(0xffffffffffffffff,"setenv");
  }
  bVar1 = co_is_enable_sys_hook();
  if (((bVar1) && (g_co_sysenv.data != (stCoSysEnv_t *)0x0)) &&
     (psVar3 = co_self(), psVar3 != (stCoRoutine_t *)0x0)) {
    if (psVar3->pvEnv == (void *)0x0) {
      psVar4 = dup_co_sysenv_arr(&g_co_sysenv);
      psVar3->pvEnv = psVar4;
    }
    name.value = (char *)psVar3->pvEnv;
    name.name = (char *)0x0;
    e = (stCoSysEnv_t *)__name;
    pvVar5 = bsearch(&e,*(void **)name.value,*(size_t *)(name.value + 8),0x10,co_sysenv_comp);
    if (pvVar5 != (void *)0x0) {
      if ((__replace != 0) || (*(long *)((long)pvVar5 + 8) == 0)) {
        if (*(long *)((long)pvVar5 + 8) != 0) {
          free(*(void **)((long)pvVar5 + 8));
        }
        if (__value == (char *)0x0) {
          local_78 = (char *)0x0;
        }
        else {
          local_78 = strdup(__value);
        }
        *(char **)((long)pvVar5 + 8) = local_78;
      }
      return 0;
    }
  }
  iVar2 = (*g_sys_setenv_func)(__name,__value,__replace);
  return iVar2;
}

Assistant:

int setenv(const char *n, const char *value, int overwrite)
{
	HOOK_SYS_FUNC( setenv )
	if( co_is_enable_sys_hook() && g_co_sysenv.data )
	{
		stCoRoutine_t *self = co_self();
		if( self )
		{
			if( !self->pvEnv )
			{
				self->pvEnv = dup_co_sysenv_arr( &g_co_sysenv );
			}
			stCoSysEnvArr_t *arr = (stCoSysEnvArr_t*)(self->pvEnv);

			stCoSysEnv_t name = { (char*)n,0 };

			stCoSysEnv_t *e = (stCoSysEnv_t*)bsearch( &name,arr->data,arr->cnt,sizeof(name),co_sysenv_comp );

			if( e )
			{
				if( overwrite || !e->value  )
				{
					if( e->value ) free( e->value );
					e->value = ( value ? strdup( value ) : 0 );
				}
				return 0;
			}
		}

	}
	return g_sys_setenv_func( n,value,overwrite );
}